

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

int create_hashtable(hash_table_t *table,size_t initial_size,hash_func_t hashfunc,hash_cmp_t keycmp)

{
  size_t __size;
  int iVar1;
  hash_entry_t *__s;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  iVar1 = getpagesize();
  uVar3 = (ulong)(int)((ulong)(long)iVar1 / 0x30);
  iVar1 = 0;
  uVar2 = initial_size % uVar3;
  lVar4 = uVar3 - uVar2;
  if (uVar2 == 0) {
    lVar4 = 0;
  }
  __size = (lVar4 + initial_size) * 0x30;
  __s = (hash_entry_t *)malloc(__size);
  if (__s == (hash_entry_t *)0x0) {
    iVar1 = -1;
  }
  else {
    memset(__s,0,__size);
    table->table_size = lVar4 + initial_size;
    table->entry_count = 0;
    table->hashfunc = hashfunc;
    table->keycmp = keycmp;
    table->table = __s;
    table->head = (hash_entry_t *)0x0;
  }
  return iVar1;
}

Assistant:

int create_hashtable(hash_table_t *table, size_t initial_size, hash_func_t hashfunc, 
                     hash_cmp_t keycmp)
{
   hash_entry_t *newtable;
   int entries_per_page;

   entries_per_page = gotcha_getpagesize() / sizeof(hash_entry_t);
   if (initial_size % entries_per_page)
      initial_size += entries_per_page - (initial_size % entries_per_page);

   newtable = (hash_entry_t *) gotcha_malloc(initial_size * sizeof(hash_entry_t));
   if (!newtable)
      return -1;
   gotcha_memset(newtable, 0, initial_size * sizeof(hash_entry_t));

   table->table_size = initial_size;
   table->entry_count = 0;
   table->hashfunc = hashfunc;
   table->keycmp = keycmp;
   table->table = newtable;
   table->head = NULL;
   
   return 0;
}